

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

CompressionParameters * __thiscall
kj::_::NullableValue<kj::CompressionParameters>::emplace<kj::CompressionParameters>
          (NullableValue<kj::CompressionParameters> *this,CompressionParameters *params)

{
  CompressionParameters *params_00;
  CompressionParameters *params_local;
  NullableValue<kj::CompressionParameters> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::CompressionParameters>(&(this->field_1).value);
  }
  params_00 = fwd<kj::CompressionParameters>(params);
  ctor<kj::CompressionParameters,kj::CompressionParameters>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (CompressionParameters *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }